

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmapstyle.cpp
# Opt level: O0

void __thiscall
QPixmapStyle::drawControl
          (QPixmapStyle *this,ControlElement element,QStyleOption *option,QPainter *painter,
          QWidget *widget)

{
  ControlDescriptor control;
  undefined1 uVar1;
  int iVar2;
  int iVar3;
  int dy1;
  QPixmapStylePrivate *pQVar4;
  char *pcVar5;
  QStyleOption *in_RCX;
  QStyleOption *option_00;
  QStyleOption *in_RDX;
  int in_ESI;
  QRect *in_RDI;
  QWidget *in_R8;
  long in_FS_OFFSET;
  bool up;
  QPixmapStylePixmap *pix;
  QPixmapStyleDescriptor *desc;
  QPixmapStylePrivate *d;
  QRect rect;
  QWidget *in_stack_00000988;
  QPainter *in_stack_00000990;
  QStyleOption *in_stack_00000998;
  ControlElement in_stack_000009a4;
  QCommonStyle *in_stack_000009a8;
  undefined4 in_stack_fffffffffffffef8;
  int in_stack_fffffffffffffefc;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  undefined4 in_stack_ffffffffffffff48;
  QVariant local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = d_func((QPixmapStyle *)0x3ff7f3);
  option_00 = (QStyleOption *)(ulong)(in_ESI - 0xb);
  switch(option_00) {
  case (QStyleOption *)0x0:
    drawProgressBarBackground
              ((QPixmapStyle *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
               option_00,(QPainter *)in_RDI,
               (QWidget *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8));
    break;
  case (QStyleOption *)0x1:
    drawProgressBarFill((QPixmapStyle *)in_RDX,in_RCX,(QPainter *)in_R8,(QWidget *)pQVar4);
    break;
  case (QStyleOption *)0x2:
    drawProgressBarLabel
              ((QPixmapStyle *)CONCAT44(in_ESI,in_stack_ffffffffffffff48),in_RDX,(QPainter *)in_RCX,
               in_R8);
    break;
  default:
    QCommonStyle::drawControl
              (in_stack_000009a8,in_stack_000009a4,in_stack_00000998,in_stack_00000990,
               in_stack_00000988);
    break;
  case (QStyleOption *)0x23:
    (*(code *)**(undefined8 **)in_R8)();
    pcVar5 = (char *)QMetaObject::className();
    iVar2 = qstrcmp(pcVar5,"QComboBoxPrivateContainer");
    if (iVar2 == 0) {
      QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor>::value
                ((QHash<QPixmapStyle::ControlDescriptor,_QPixmapStyleDescriptor> *)option_00,
                 (ControlDescriptor *)in_RDI);
      QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap>::value
                ((QHash<QPixmapStyle::ControlPixmap,_QPixmapStylePixmap> *)option_00,
                 (ControlPixmap *)in_RDI);
      control = *(ControlDescriptor *)&(in_RDX->rect).x1;
      iVar2 = QMargins::left((QMargins *)0x3ff976);
      iVar2 = -iVar2;
      iVar3 = QMargins::top((QMargins *)0x3ff98e);
      iVar3 = -iVar3;
      dy1 = QMargins::right((QMargins *)0x3ff9a6);
      QMargins::bottom((QMargins *)0x3ff9b8);
      QRect::adjust(in_RDI,in_stack_fffffffffffffefc,dy1,iVar3,iVar2);
      QObject::property((char *)&local_28);
      uVar1 = ::QVariant::toBool();
      ::QVariant::~QVariant(&local_28);
      drawCachedPixmap((QPixmapStyle *)
                       (CONCAT17(uVar1,in_stack_ffffffffffffff10) & 0x1ffffffffffffff),control,
                       (QRect *)option_00,(QPainter *)in_RDI);
      QPixmapStylePixmap::~QPixmapStylePixmap((QPixmapStylePixmap *)0x3ffa47);
      QPixmapStyleDescriptor::~QPixmapStyleDescriptor((QPixmapStyleDescriptor *)0x3ffa54);
    }
    else {
      QCommonStyle::drawControl
                (in_stack_000009a8,in_stack_000009a4,in_stack_00000998,in_stack_00000990,
                 in_stack_00000988);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPixmapStyle::drawControl(ControlElement element, const QStyleOption *option,
                               QPainter *painter, const QWidget *widget) const
{
    Q_D(const QPixmapStyle);

    switch (element) {
    case CE_ProgressBarGroove:
        drawProgressBarBackground(option, painter, widget);
        break;
    case CE_ProgressBarLabel:
        drawProgressBarLabel(option, painter, widget);
        break;
    case CE_ProgressBarContents:
        drawProgressBarFill(option, painter, widget);
        break;
    case CE_ShapedFrame:
        // NOTE: This will break if the private API of QComboBox changes drastically
        if (qstrcmp(widget->metaObject()->className(),"QComboBoxPrivateContainer") == 0) {
            const QPixmapStyleDescriptor &desc = d->descriptors.value(DD_PopupDown);
            const QPixmapStylePixmap &pix = d->pixmaps.value(DD_ItemSeparator);
            QRect rect = option->rect;
            rect.adjust(-pix.margins.left(), -desc.margins.top(),
                        pix.margins.right(), desc.margins.bottom());
            bool up = widget->property("_pixmapstyle_combobox_up").toBool();
            drawCachedPixmap(up ? DD_PopupUp : DD_PopupDown, rect, painter);
        }
        else {
            QCommonStyle::drawControl(element, option, painter, widget);
        }
        break;
    default:
        QCommonStyle::drawControl(element, option, painter, widget);
    }
}